

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::AppendPartialToString(MessageLite *this,string *output)

{
  bool bVar1;
  LogMessage *pLVar2;
  ulong value;
  LogMessage *this_00;
  LogMessage *in_RDI;
  int unaff_retaddr;
  uint8 *in_stack_00000008;
  MessageLite *in_stack_00000010;
  uint8 *start;
  size_t byte_size;
  size_t old_size;
  string *in_stack_ffffffffffffff48;
  LogMessage *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  LogLevel level;
  string local_80 [88];
  
  level = (LogLevel)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  pLVar2 = (LogMessage *)std::__cxx11::string::size();
  value = (**(code **)(*(long *)in_RDI + 0x48))();
  bVar1 = value < 0x80000000;
  if (bVar1) {
    STLStringResizeUninitialized
              ((string *)in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48);
    io::mutable_string_data((string *)0x419043);
    SerializeToArrayImpl(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  }
  else {
    internal::LogMessage::LogMessage
              (in_RDI,level,(char *)in_stack_ffffffffffffff50,
               (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    (**(code **)(*(long *)in_RDI + 0x10))(local_80);
    internal::LogMessage::operator<<(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    this_00 = internal::LogMessage::operator<<
                        (in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,value);
    internal::LogFinisher::operator=((LogFinisher *)this_00,pLVar2);
    std::__cxx11::string::~string(local_80);
    internal::LogMessage::~LogMessage((LogMessage *)0x418fd8);
  }
  return bVar1;
}

Assistant:

bool MessageLite::AppendPartialToString(std::string* output) const {
  size_t old_size = output->size();
  size_t byte_size = ByteSizeLong();
  if (byte_size > INT_MAX) {
    GOOGLE_LOG(ERROR) << GetTypeName()
               << " exceeded maximum protobuf size of 2GB: " << byte_size;
    return false;
  }

  STLStringResizeUninitialized(output, old_size + byte_size);
  uint8* start =
      reinterpret_cast<uint8*>(io::mutable_string_data(output) + old_size);
  SerializeToArrayImpl(*this, start, byte_size);
  return true;
}